

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MaxDrawBuffersIndexedTest::MaxDrawBuffersIndexedTest
          (MaxDrawBuffersIndexedTest *this,Context *context,int seed)

{
  deUint32 dVar1;
  char *name;
  char *description;
  string local_60;
  string local_40;
  int local_1c;
  Context *pCStack_18;
  int seed_local;
  Context *context_local;
  MaxDrawBuffersIndexedTest *this_local;
  
  local_1c = seed;
  pCStack_18 = context;
  context_local = (Context *)this;
  de::toString<int>(&local_40,&local_1c);
  name = (char *)std::__cxx11::string::c_str();
  de::toString<int>(&local_60,&local_1c);
  description = (char *)std::__cxx11::string::c_str();
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MaxDrawBuffersIndexedTest_011d08e0;
  dVar1 = deInt32Hash(local_1c);
  this->m_seed = dVar1 ^ 0x5cdd369b;
  return;
}

Assistant:

MaxDrawBuffersIndexedTest::MaxDrawBuffersIndexedTest (Context& context, int seed)
	: TestCase	(context, de::toString(seed).c_str(), de::toString(seed).c_str())
	, m_seed	(deInt32Hash(seed) ^ 1558001307u)
{
}